

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_12a4996::TGlslangToSpvTraverser::createNoArgOperation
          (TGlslangToSpvTraverser *this,TOperator op,Decoration precision,Id typeId)

{
  bool bVar1;
  SpvBuildLogger *this_00;
  Id IVar2;
  Scope memory;
  MemorySemanticsMask MVar3;
  set<spv::Capability,_std::less<spv::Capability>,_std::allocator<spv::Capability>_> *this_01;
  uint uVar4;
  Op OVar5;
  Scope execution;
  vector<unsigned_int,_std::allocator<unsigned_int>_> args;
  Capability local_4c;
  string local_48;
  
  if (0x161 < (int)op) {
    if (0x2a9 < (int)op) {
      if ((int)op < 0x2de) {
        switch(op) {
        case EOpAllMemoryBarrierWithGroupSync:
          MVar3 = spv::MemorySemanticsAllMemory | AcquireRelease;
          execution = ScopeWorkgroup;
          memory = Device;
          break;
        case EOpDeviceMemoryBarrier:
          uVar4 = 1;
          MVar3 = ImageMemory|MemorySemanticsUniformMemoryMask|AcquireRelease;
          goto LAB_0044b749;
        case EOpDeviceMemoryBarrierWithGroupSync:
          execution = ScopeWorkgroup;
          memory = Device;
          MVar3 = ImageMemory|MemorySemanticsUniformMemoryMask|AcquireRelease;
          break;
        case EOpWorkgroupMemoryBarrier:
          uVar4 = 2;
          goto LAB_0044b731;
        case EOpWorkgroupMemoryBarrierWithGroupSync:
          goto LAB_0044b601;
        default:
          goto switchD_0044b228_caseD_af;
        }
        goto LAB_0044b71e;
      }
      if (op - EOpStencilAttachmentReadEXT < 2) {
        spv::Builder::addExtension(&this->builder,"SPV_EXT_shader_tile_image");
        this_01 = &(this->builder).capabilities;
        if (op == EOpStencilAttachmentReadEXT) {
          local_48._M_dataplus._M_p._0_4_ = 0x1048;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)this_01,(Capability *)&local_48);
          OVar5 = OpStencilAttachmentReadEXT;
          precision = DecorationRelaxedPrecision;
        }
        else {
          local_48._M_dataplus._M_p._0_4_ = 0x1047;
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)this_01,(Capability *)&local_48);
          OVar5 = OpDepthAttachmentReadEXT;
          precision = DecorationMax;
        }
        local_48._M_dataplus._M_p = (pointer)0x0;
        local_48._M_string_length = 0;
        local_48.field_2._M_allocated_capacity = 0;
        IVar2 = spv::Builder::createOp
                          (&this->builder,OVar5,typeId,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        if (IVar2 == 0 || op != EOpStencilAttachmentReadEXT) goto LAB_0044b7db;
        goto LAB_0044b7cc;
      }
      if (op == EOpReadClockSubgroupKHR) {
        local_48._M_dataplus._M_p = (pointer)0x0;
        local_48._M_string_length = 0;
        local_48.field_2._M_allocated_capacity = 0;
        IVar2 = spv::Builder::makeIntegerType(&this->builder,0x20,false);
        uVar4 = 3;
      }
      else {
        if (op != EOpReadClockDeviceKHR) goto switchD_0044b228_caseD_af;
        local_48._M_dataplus._M_p = (pointer)0x0;
        local_48._M_string_length = 0;
        local_48.field_2._M_allocated_capacity = 0;
        IVar2 = spv::Builder::makeIntegerType(&this->builder,0x20,false);
        uVar4 = 1;
      }
      local_4c = spv::Builder::makeIntConstant(&this->builder,IVar2,uVar4,false);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,(iterator)0x0,
                 &local_4c);
      spv::Builder::addExtension(&this->builder,"SPV_KHR_shader_clock");
      local_4c = CapabilityShaderClockKHR;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,&local_4c);
      OVar5 = OpReadClockKHR;
LAB_0044b6f4:
      IVar2 = spv::Builder::createOp
                        (&this->builder,OVar5,typeId,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
LAB_0044b7db:
      if (local_48._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_48._M_dataplus._M_p,
                        local_48.field_2._M_allocated_capacity - (long)local_48._M_dataplus._M_p);
        return IVar2;
      }
      return IVar2;
    }
    switch(op) {
    case EOpIgnoreIntersectionNV:
      OVar5 = OpIgnoreIntersectionNV;
      break;
    case EOpTerminateRayNV:
      OVar5 = OpTerminateRayNV;
      break;
    case EOpExecuteCallableNV:
    case EOpExecuteCallableKHR:
    case EOpWritePackedPrimitiveIndices4x8NV:
    case EOpEmitMeshTasksEXT:
    case EOpSetMeshOutputsEXT:
switchD_0044b228_caseD_af:
      this_00 = this->logger;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"unknown operation with no arguments","");
      spv::SpvBuildLogger::missingFunctionality(this_00,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return 0;
      }
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      return 0;
    case EOpRayQueryInitialize:
      OVar5 = OpRayQueryInitializeKHR;
      break;
    case EOpRayQueryTerminate:
      OVar5 = OpRayQueryTerminateKHR;
      break;
    case EOpRayQueryGenerateIntersection:
      OVar5 = OpRayQueryGenerateIntersectionKHR;
      break;
    case EOpRayQueryConfirmIntersection:
      OVar5 = OpRayQueryConfirmIntersectionKHR;
      break;
    default:
      if (op == EOpEndInvocationInterlock) {
        OVar5 = OpEndInvocationInterlockEXT;
        break;
      }
      if (op != EOpIsHelperInvocation) goto switchD_0044b228_caseD_af;
      local_48._M_dataplus._M_p = (pointer)0x0;
      local_48._M_string_length = 0;
      local_48.field_2._M_allocated_capacity = 0;
      spv::Builder::addExtension(&this->builder,"SPV_EXT_demote_to_helper_invocation");
      local_4c = CapabilityDemoteToHelperInvocation;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                  *)&(this->builder).capabilities,&local_4c);
      OVar5 = OpIsHelperInvocationEXT;
      goto LAB_0044b6f4;
    }
    goto LAB_0044b75c;
  }
  if (0x17 < op - EOpEmitVertex) {
    if (op != EOpTime) {
      if (op != EOpBeginInvocationInterlock) goto switchD_0044b228_caseD_af;
      OVar5 = OpBeginInvocationInterlockEXT;
      goto LAB_0044b75c;
    }
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    IVar2 = getExtBuiltins(this,"SPV_AMD_gcn_shader");
    IVar2 = spv::Builder::createBuiltinCall
                      (&this->builder,typeId,IVar2,3,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    if (IVar2 == 0 || precision == DecorationMax) goto LAB_0044b7db;
LAB_0044b7cc:
    spv::Builder::addDecoration(&this->builder,IVar2,precision,-1);
    goto LAB_0044b7db;
  }
  bVar1 = this->glslangIntermediate->useVulkanMemoryModel;
  uVar4 = (uint)bVar1 * 4 + 1;
  switch(op) {
  case EOpEmitVertex:
    OVar5 = OpEmitVertex;
    goto LAB_0044b75c;
  case EOpEndPrimitive:
    OVar5 = OpEndPrimitive;
LAB_0044b75c:
    spv::Builder::createNoResultOp(&this->builder,OVar5);
    return 0;
  default:
    goto switchD_0044b228_caseD_af;
  case EOpBarrier:
    if (this->glslangIntermediate->language == EShLangTessControl) {
      if (bVar1 != false) {
        spv::Builder::createControlBarrier
                  (&this->builder,ScopeWorkgroup,ScopeWorkgroup,
                   MemorySemanticsOutputMemoryKHRMask|AcquireRelease);
        local_48._M_dataplus._M_p._0_4_ = 0x14e1;
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&(this->builder).capabilities,(Capability *)&local_48);
        return 0;
      }
      spv::Builder::createControlBarrier(&this->builder,ScopeWorkgroup,Invocation,MaskNone);
      return 0;
    }
LAB_0044b601:
    execution = ScopeWorkgroup;
    memory = ScopeWorkgroup;
    MVar3 = MemorySemanticsWorkgroupMemoryMask|AcquireRelease;
LAB_0044b71e:
    spv::Builder::createControlBarrier(&this->builder,execution,memory,MVar3);
    return 0;
  case EOpMemoryBarrier:
    MVar3 = spv::MemorySemanticsAllMemory | AcquireRelease;
    break;
  case EOpMemoryBarrierAtomicCounter:
    MVar3 = AtomicCounterMemory|AcquireRelease;
    break;
  case EOpMemoryBarrierBuffer:
    goto LAB_0044b5da;
  case EOpMemoryBarrierImage:
    goto LAB_0044b5f0;
  case EOpMemoryBarrierShared:
    goto LAB_0044b731;
  case EOpGroupMemoryBarrier:
    MVar3 = spv::MemorySemanticsAllMemory | AcquireRelease;
    uVar4 = 2;
    break;
  case EOpSubgroupBarrier:
    MVar3 = spv::MemorySemanticsAllMemory | AcquireRelease;
    execution = ScopeSubgroup;
    memory = ScopeSubgroup;
    goto LAB_0044b71e;
  case EOpSubgroupMemoryBarrier:
    MVar3 = spv::MemorySemanticsAllMemory | AcquireRelease;
    uVar4 = 3;
    break;
  case EOpSubgroupMemoryBarrierBuffer:
    uVar4 = 3;
LAB_0044b5da:
    MVar3 = MemorySemanticsUniformMemoryMask|AcquireRelease;
    break;
  case EOpSubgroupMemoryBarrierImage:
    uVar4 = 3;
LAB_0044b5f0:
    MVar3 = ImageMemory|AcquireRelease;
    break;
  case EOpSubgroupMemoryBarrierShared:
    uVar4 = 3;
LAB_0044b731:
    MVar3 = MemorySemanticsWorkgroupMemoryMask|AcquireRelease;
    break;
  case EOpSubgroupElect:
    local_48._M_dataplus._M_p = (pointer)0x0;
    local_48._M_string_length = 0;
    local_48.field_2._M_allocated_capacity = 0;
    IVar2 = createSubgroupOperation
                      (this,EOpSubgroupElect,typeId,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,EbtVoid);
    return IVar2;
  }
LAB_0044b749:
  spv::Builder::createMemoryBarrier(&this->builder,uVar4,MVar3);
  return 0;
}

Assistant:

spv::Id TGlslangToSpvTraverser::createNoArgOperation(glslang::TOperator op, spv::Decoration precision, spv::Id typeId)
{
    // GLSL memory barriers use queuefamily scope in new model, device scope in old model
    spv::Scope memoryBarrierScope = glslangIntermediate->usingVulkanMemoryModel() ?
        spv::ScopeQueueFamilyKHR : spv::ScopeDevice;

    switch (op) {
    case glslang::EOpBarrier:
        if (glslangIntermediate->getStage() == EShLangTessControl) {
            if (glslangIntermediate->usingVulkanMemoryModel()) {
                builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeWorkgroup,
                                             spv::MemorySemanticsOutputMemoryKHRMask |
                                             spv::MemorySemanticsAcquireReleaseMask);
                builder.addCapability(spv::CapabilityVulkanMemoryModelKHR);
            } else {
                builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeInvocation, spv::MemorySemanticsMaskNone);
            }
        } else {
            builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeWorkgroup,
                                            spv::MemorySemanticsWorkgroupMemoryMask |
                                            spv::MemorySemanticsAcquireReleaseMask);
        }
        return 0;
    case glslang::EOpMemoryBarrier:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsAllMemory |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierBuffer:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsUniformMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierShared:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsWorkgroupMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpGroupMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeWorkgroup, spv::MemorySemanticsAllMemory |
                                                         spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierAtomicCounter:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsAtomicCounterMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpMemoryBarrierImage:
        builder.createMemoryBarrier(memoryBarrierScope, spv::MemorySemanticsImageMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpAllMemoryBarrierWithGroupSync:
        builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeDevice,
                                        spv::MemorySemanticsAllMemory |
                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpDeviceMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeDevice, spv::MemorySemanticsUniformMemoryMask |
                                                      spv::MemorySemanticsImageMemoryMask |
                                                      spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpDeviceMemoryBarrierWithGroupSync:
        builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeDevice, spv::MemorySemanticsUniformMemoryMask |
                                                                            spv::MemorySemanticsImageMemoryMask |
                                                                            spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpWorkgroupMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeWorkgroup, spv::MemorySemanticsWorkgroupMemoryMask |
                                                         spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpWorkgroupMemoryBarrierWithGroupSync:
        builder.createControlBarrier(spv::ScopeWorkgroup, spv::ScopeWorkgroup,
                                        spv::MemorySemanticsWorkgroupMemoryMask |
                                        spv::MemorySemanticsAcquireReleaseMask);
        return 0;
    case glslang::EOpSubgroupBarrier:
        builder.createControlBarrier(spv::ScopeSubgroup, spv::ScopeSubgroup, spv::MemorySemanticsAllMemory |
                                                                             spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrier:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsAllMemory |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrierBuffer:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsUniformMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrierImage:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsImageMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;
    case glslang::EOpSubgroupMemoryBarrierShared:
        builder.createMemoryBarrier(spv::ScopeSubgroup, spv::MemorySemanticsWorkgroupMemoryMask |
                                                        spv::MemorySemanticsAcquireReleaseMask);
        return spv::NoResult;

    case glslang::EOpEmitVertex:
        builder.createNoResultOp(spv::OpEmitVertex);
        return 0;
    case glslang::EOpEndPrimitive:
        builder.createNoResultOp(spv::OpEndPrimitive);
        return 0;

    case glslang::EOpSubgroupElect: {
        std::vector<spv::Id> operands;
        return createSubgroupOperation(op, typeId, operands, glslang::EbtVoid);
    }
    case glslang::EOpTime:
    {
        std::vector<spv::Id> args; // Dummy arguments
        spv::Id id = builder.createBuiltinCall(typeId, getExtBuiltins(spv::E_SPV_AMD_gcn_shader), spv::TimeAMD, args);
        return builder.setPrecision(id, precision);
    }
    case glslang::EOpIgnoreIntersectionNV:
        builder.createNoResultOp(spv::OpIgnoreIntersectionNV);
        return 0;
    case glslang::EOpTerminateRayNV:
        builder.createNoResultOp(spv::OpTerminateRayNV);
        return 0;
    case glslang::EOpRayQueryInitialize:
        builder.createNoResultOp(spv::OpRayQueryInitializeKHR);
        return 0;
    case glslang::EOpRayQueryTerminate:
        builder.createNoResultOp(spv::OpRayQueryTerminateKHR);
        return 0;
    case glslang::EOpRayQueryGenerateIntersection:
        builder.createNoResultOp(spv::OpRayQueryGenerateIntersectionKHR);
        return 0;
    case glslang::EOpRayQueryConfirmIntersection:
        builder.createNoResultOp(spv::OpRayQueryConfirmIntersectionKHR);
        return 0;
    case glslang::EOpBeginInvocationInterlock:
        builder.createNoResultOp(spv::OpBeginInvocationInterlockEXT);
        return 0;
    case glslang::EOpEndInvocationInterlock:
        builder.createNoResultOp(spv::OpEndInvocationInterlockEXT);
        return 0;

    case glslang::EOpIsHelperInvocation:
    {
        std::vector<spv::Id> args; // Dummy arguments
        builder.addExtension(spv::E_SPV_EXT_demote_to_helper_invocation);
        builder.addCapability(spv::CapabilityDemoteToHelperInvocationEXT);
        return builder.createOp(spv::OpIsHelperInvocationEXT, typeId, args);
    }

    case glslang::EOpReadClockSubgroupKHR: {
        std::vector<spv::Id> args;
        args.push_back(builder.makeUintConstant(spv::ScopeSubgroup));
        builder.addExtension(spv::E_SPV_KHR_shader_clock);
        builder.addCapability(spv::CapabilityShaderClockKHR);
        return builder.createOp(spv::OpReadClockKHR, typeId, args);
    }

    case glslang::EOpReadClockDeviceKHR: {
        std::vector<spv::Id> args;
        args.push_back(builder.makeUintConstant(spv::ScopeDevice));
        builder.addExtension(spv::E_SPV_KHR_shader_clock);
        builder.addCapability(spv::CapabilityShaderClockKHR);
        return builder.createOp(spv::OpReadClockKHR, typeId, args);
    }
    case glslang::EOpStencilAttachmentReadEXT:
    case glslang::EOpDepthAttachmentReadEXT:
    {
        builder.addExtension(spv::E_SPV_EXT_shader_tile_image);

        spv::Decoration precision;
        spv::Op spv_op;
        if (op == glslang::EOpStencilAttachmentReadEXT)
        {
            precision = spv::DecorationRelaxedPrecision;
            spv_op = spv::OpStencilAttachmentReadEXT;
            builder.addCapability(spv::CapabilityTileImageStencilReadAccessEXT);
        }
        else
        {
            precision = spv::NoPrecision;
            spv_op = spv::OpDepthAttachmentReadEXT;
            builder.addCapability(spv::CapabilityTileImageDepthReadAccessEXT);
        }

        std::vector<spv::Id> args; // Dummy args
        spv::Id result = builder.createOp(spv_op, typeId, args);
        return builder.setPrecision(result, precision);
    }
    default:
        break;
    }

    logger->missingFunctionality("unknown operation with no arguments");

    return 0;
}